

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::compare(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  char *pcVar2;
  byte in_DL;
  undefined8 in_RSI;
  dynamic_string *in_RDI;
  int result;
  code *local_30;
  int local_4;
  
  if ((in_DL & 1) == 0) {
    local_30 = strcasecmp;
  }
  else {
    local_30 = strcmp;
  }
  pcVar2 = get_ptr_priv(in_RDI);
  iVar1 = (*local_30)(pcVar2,in_RSI);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int dynamic_string::compare(const char* p, bool case_sensitive) const {
  CRNLIB_ASSERT(p);

  const int result = (case_sensitive ? strcmp : crnlib_stricmp)(get_ptr_priv(), p);

  if (result < 0)
    return -1;
  else if (result > 0)
    return 1;

  return 0;
}